

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O2

bool __thiscall
draco::ObjDecoder::ParseMaterialFile(ObjDecoder *this,string *file_name,Status *status)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  Status *pSVar4;
  vector<char,_std::allocator<char>_> buffer;
  DecoderBuffer old_buffer;
  string full_path;
  _Vector_base<char,_std::allocator<char>_> local_98;
  char *local_78;
  int64_t iStack_70;
  int64_t local_68;
  BitDecoder BStack_60;
  undefined8 local_48;
  string local_38;
  
  GetFullPath(&local_38,file_name,&this->input_file_name_);
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = ReadFileToBuffer(&local_38,(vector<char,_std::allocator<char>_> *)&local_98);
  if (bVar2) {
    local_48._0_1_ = (this->buffer_).bit_mode_;
    local_48._1_1_ = (this->buffer_).field_0x31;
    local_48._2_2_ = (this->buffer_).bitstream_version_;
    local_48._4_4_ = *(undefined4 *)&(this->buffer_).field_0x34;
    local_78 = (this->buffer_).data_;
    iStack_70 = (this->buffer_).data_size_;
    local_68 = (this->buffer_).pos_;
    BStack_60.bit_buffer_ = (this->buffer_).bit_decoder_.bit_buffer_;
    BStack_60.bit_buffer_end_ = (this->buffer_).bit_decoder_.bit_buffer_end_;
    BStack_60.bit_offset_ = (this->buffer_).bit_decoder_.bit_offset_;
    pSVar4 = (Status *)local_98._M_impl.super__Vector_impl_data._M_start;
    DecoderBuffer::Init(&this->buffer_,local_98._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_98._M_impl.super__Vector_impl_data._M_start);
    this->num_materials_ = 0;
    do {
      bVar3 = ParseMaterialFileDefinition(this,pSVar4);
      uVar1 = local_48;
    } while (bVar3);
    (this->buffer_).bit_mode_ = (bool)(undefined1)local_48;
    (this->buffer_).field_0x31 = local_48._1_1_;
    (this->buffer_).bitstream_version_ = local_48._2_2_;
    (this->buffer_).bit_decoder_.bit_buffer_end_ = BStack_60.bit_buffer_end_;
    (this->buffer_).bit_decoder_.bit_offset_ = BStack_60.bit_offset_;
    (this->buffer_).pos_ = local_68;
    (this->buffer_).bit_decoder_.bit_buffer_ = BStack_60.bit_buffer_;
    (this->buffer_).data_ = local_78;
    (this->buffer_).data_size_ = iStack_70;
    local_48 = uVar1;
    DecoderBuffer::BitDecoder::~BitDecoder(&BStack_60);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_98);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar2;
}

Assistant:

bool ObjDecoder::ParseMaterialFile(const std::string &file_name,
                                   Status *status) {
  const std::string full_path = GetFullPath(file_name, input_file_name_);
  std::vector<char> buffer;
  if (!ReadFileToBuffer(full_path, &buffer)) {
    return false;
  }

  // Backup the original decoder buffer.
  DecoderBuffer old_buffer = buffer_;

  buffer_.Init(buffer.data(), buffer.size());

  num_materials_ = 0;
  while (ParseMaterialFileDefinition(status)) {
  }

  // Restore the original buffer.
  buffer_ = old_buffer;
  return true;
}